

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::FinalizePending(void)

{
  void *pvVar1;
  uint uVar2;
  Range *pRVar3;
  markerType *marker_00;
  ExternTypeInfo *type;
  uint local_48;
  uint count;
  uint arrayPadding;
  char *base;
  ExternTypeInfo *typeInfo;
  markerType *marker;
  void *block;
  Range *curr;
  uint i;
  
  curr._4_4_ = 0;
  while( true ) {
    uVar2 = FastVector<NULLC::Range,_false,_false>::size
                      ((FastVector<NULLC::Range,_false,_false> *)blocksToFinalize);
    if (uVar2 <= curr._4_4_) break;
    pRVar3 = FastVector<NULLC::Range,_false,_false>::operator[]
                       ((FastVector<NULLC::Range,_false,_false> *)blocksToFinalize,curr._4_4_);
    pvVar1 = pRVar3->start;
    marker_00 = (markerType *)((long)pvVar1 + 4);
    *marker_00 = OBJECT_VISIBLE | *marker_00;
    type = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                      (uint)(*marker_00 >> 8) & 0xffffff);
    if ((*marker_00 & OBJECT_ARRAY) == 0) {
      GC::CheckVariable((char *)((long)pvVar1 + 0xc),type);
    }
    else {
      if (type->defaultAlign < 5) {
        local_48 = 4;
      }
      else {
        local_48 = (uint)type->defaultAlign;
      }
      GC::CheckArrayElements
                ((char *)((long)pvVar1 + (ulong)local_48 + 0xc),
                 *(uint *)((long)pvVar1 + (ulong)local_48 + 8),type);
    }
    FinalizeObject(marker_00,(char *)((long)pvVar1 + 4));
    curr._4_4_ = curr._4_4_ + 1;
  }
  FastVector<NULLC::Range,_false,_false>::clear
            ((FastVector<NULLC::Range,_false,_false> *)blocksToFinalize);
  ObjectBlockPool<8,_8192>::FinalizePending((ObjectBlockPool<8,_8192> *)pool8);
  ObjectBlockPool<16,_4096>::FinalizePending((ObjectBlockPool<16,_4096> *)pool16);
  ObjectBlockPool<32,_2048>::FinalizePending((ObjectBlockPool<32,_2048> *)pool32);
  ObjectBlockPool<64,_1024>::FinalizePending((ObjectBlockPool<64,_1024> *)pool64);
  ObjectBlockPool<128,_512>::FinalizePending((ObjectBlockPool<128,_512> *)pool128);
  ObjectBlockPool<256,_256>::FinalizePending((ObjectBlockPool<256,_256> *)pool256);
  ObjectBlockPool<512,_128>::FinalizePending((ObjectBlockPool<512,_128> *)pool512);
  GC::MarkPendingRoots();
  return;
}

Assistant:

void NULLC::FinalizePending()
{
	for(unsigned i = 0; i < blocksToFinalize.size(); i++)
	{
		Range &curr = blocksToFinalize[i];

		void *block = curr.start;

		markerType &marker = *(markerType*)((char*)block + 4);

		// Mark block as used
		marker |= NULLC::OBJECT_VISIBLE;

		ExternTypeInfo &typeInfo = NULLC::linker->exTypes[(unsigned)marker >> 8];

		char *base = (char*)block + 4;

		if(marker & NULLC::OBJECT_ARRAY)
		{
			unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

			unsigned count = *(unsigned*)(base + sizeof(markerType) + arrayPadding - 4);

			GC::CheckArrayElements(base + sizeof(markerType) + arrayPadding, count, typeInfo);
		}
		else
		{
			GC::CheckVariable(base + sizeof(markerType), typeInfo);
		}

		NULLC::FinalizeObject(marker, (char*)block + 4);
	}

	blocksToFinalize.clear();

	pool8.FinalizePending();
	pool16.FinalizePending();
	pool32.FinalizePending();
	pool64.FinalizePending();
	pool128.FinalizePending();
	pool256.FinalizePending();
	pool512.FinalizePending();

	// Mark new roots
	GC::MarkPendingRoots();
}